

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.h
# Opt level: O1

void __thiscall
rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
ImplicitConcatenation
          (GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this,
          Stack<rapidjson::CrtAllocator> *atomCountStack,
          Stack<rapidjson::CrtAllocator> *operatorStack)

{
  int *piVar1;
  Operator *pOVar2;
  
  if (3 < (ulong)((long)atomCountStack->stackTop_ - (long)atomCountStack->stack_)) {
    if (*(int *)(atomCountStack->stackTop_ + -4) != 0) {
      pOVar2 = Stack<rapidjson::CrtAllocator>::
               Push<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::Operator>
                         (operatorStack,1);
      *pOVar2 = kConcatenation;
    }
    if (3 < (ulong)((long)atomCountStack->stackTop_ - (long)atomCountStack->stack_)) {
      piVar1 = (int *)(atomCountStack->stackTop_ + -4);
      *piVar1 = *piVar1 + 1;
      return;
    }
  }
  __assert_fail("GetSize() >= sizeof(T)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/internal/stack.h"
                ,0x92,
                "T *rapidjson::internal::Stack<rapidjson::CrtAllocator>::Top() [Allocator = rapidjson::CrtAllocator, T = unsigned int]"
               );
}

Assistant:

Range& GetRange(SizeType index) {
        RAPIDJSON_ASSERT(index < rangeCount_);
        return ranges_.template Bottom<Range>()[index];
    }